

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFNMatrix<1,_Fad<double>_>::TPZFNMatrix
          (TPZFNMatrix<1,_Fad<double>_> *this,int64_t row,int64_t col,Fad<double> *val)

{
  Fad<double> FStack_48;
  
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01737748;
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&this->super_TPZFMatrix<Fad<double>_>,&PTR_PTR_01737a00,row,col,this->fBuf,1);
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01737748;
  Fad<double>::Fad(this->fBuf);
  Fad<double>::Fad(this->fBuf + 1);
  Fad<double>::Fad(&FStack_48,val);
  TPZFMatrix<Fad<double>_>::operator=(&this->super_TPZFMatrix<Fad<double>_>,&FStack_48);
  Fad<double>::~Fad(&FStack_48);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }